

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_list_view_begin(nk_context *ctx,nk_list_view *view,char *title,nk_flags flags,int row_height,
                      int row_count)

{
  nk_window *win_00;
  nk_panel *pnVar1;
  int iVar2;
  nk_hash name;
  int local_90;
  int local_8c;
  float local_88;
  int local_84;
  int local_7c;
  float fStack_74;
  nk_vec2 item_spacing;
  nk_style *style;
  nk_panel *layout;
  nk_window *win;
  nk_uint *pnStack_50;
  int result;
  nk_uint *y_offset;
  nk_uint *x_offset;
  nk_hash title_hash;
  int title_len;
  int row_count_local;
  int row_height_local;
  nk_flags flags_local;
  char *title_local;
  nk_list_view *view_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x491b,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (view == (nk_list_view *)0x0) {
    __assert_fail("view",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x491c,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x491d,
                  "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                 );
  }
  if (((ctx == (nk_context *)0x0) || (view == (nk_list_view *)0x0)) || (title == (char *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    win_00 = ctx->current;
    fStack_74 = (ctx->style).window.spacing.y;
    if ((int)fStack_74 < 1) {
      local_7c = 0;
    }
    else {
      local_7c = (int)fStack_74;
    }
    local_7c = local_7c + row_height;
    iVar2 = nk_strlen(title);
    name = nk_murmur_hash(title,iVar2,2);
    y_offset = nk_find_value(win_00,name);
    if (y_offset == (nk_uint *)0x0) {
      y_offset = nk_add_value(ctx,win_00,name,0);
      pnStack_50 = nk_add_value(ctx,win_00,name + 1,0);
      if (y_offset == (nk_uint *)0x0) {
        __assert_fail("x_offset",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x492d,
                      "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                     );
      }
      if (pnStack_50 == (nk_uint *)0x0) {
        __assert_fail("y_offset",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x492e,
                      "int nk_list_view_begin(struct nk_context *, struct nk_list_view *, const char *, nk_flags, int, int)"
                     );
      }
      if ((y_offset == (nk_uint *)0x0) || (pnStack_50 == (nk_uint *)0x0)) {
        return 0;
      }
      *pnStack_50 = 0;
      *y_offset = 0;
    }
    else {
      pnStack_50 = nk_find_value(win_00,name + 1);
    }
    view->scroll_value = *pnStack_50;
    view->scroll_pointer = pnStack_50;
    *pnStack_50 = 0;
    ctx_local._4_4_ = nk_group_scrolled_offset_begin(ctx,y_offset,pnStack_50,title,flags);
    pnVar1 = ctx->current->layout;
    local_84 = row_count;
    if (row_count < 1) {
      local_84 = 1;
    }
    view->total_height = local_7c * local_84;
    if (0.0 <= (float)view->scroll_value / (float)local_7c) {
      local_88 = (float)view->scroll_value / (float)local_7c;
    }
    else {
      local_88 = 0.0;
    }
    view->begin = (int)local_88;
    iVar2 = nk_iceilf((pnVar1->clip).h / (float)local_7c);
    if (iVar2 < 0) {
      local_8c = 0;
    }
    else {
      local_8c = nk_iceilf((pnVar1->clip).h / (float)local_7c);
    }
    view->count = local_8c;
    if (view->count < row_count - view->begin) {
      local_90 = view->count;
    }
    else {
      local_90 = row_count - view->begin;
    }
    view->count = local_90;
    view->end = view->begin + view->count;
    view->ctx = ctx;
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_list_view_begin(struct nk_context *ctx, struct nk_list_view *view,
    const char *title, nk_flags flags, int row_height, int row_count)
{
    int title_len;
    nk_hash title_hash;
    nk_uint *x_offset;
    nk_uint *y_offset;

    int result;
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_vec2 item_spacing;

    NK_ASSERT(ctx);
    NK_ASSERT(view);
    NK_ASSERT(title);
    if (!ctx || !view || !title) return 0;

    win = ctx->current;
    style = &ctx->style;
    item_spacing = style->window.spacing;
    row_height += NK_MAX(0, (int)item_spacing.y);

    /* find persistent list view scrollbar offset */
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, title_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, title_hash, 0);
        y_offset = nk_add_value(ctx, win, title_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, title_hash+1);
    view->scroll_value = *y_offset;
    view->scroll_pointer = y_offset;

    *y_offset = 0;
    result = nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
    win = ctx->current;
    layout = win->layout;

    view->total_height = row_height * NK_MAX(row_count,1);
    view->begin = (int)NK_MAX(((float)view->scroll_value / (float)row_height), 0.0f);
    view->count = (int)NK_MAX(nk_iceilf((layout->clip.h)/(float)row_height),0);
    view->count = NK_MIN(view->count, row_count - view->begin);
    view->end = view->begin + view->count;
    view->ctx = ctx;
    return result;
}